

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImplicationConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ImplicationConstraintSyntax_const&>
          (BumpAllocator *this,ImplicationConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ImplicationConstraintSyntax *pIVar10;
  
  pIVar10 = (ImplicationConstraintSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->left).ptr;
  TVar6 = (args->arrow).kind;
  uVar7 = (args->arrow).field_0x2;
  NVar8.raw = (args->arrow).numFlags.raw;
  uVar9 = (args->arrow).rawLen;
  pIVar4 = (args->arrow).info;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.kind =
       (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->left).ptr = pEVar3;
  (pIVar10->arrow).kind = TVar6;
  (pIVar10->arrow).field_0x2 = uVar7;
  (pIVar10->arrow).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar10->arrow).rawLen = uVar9;
  (pIVar10->arrow).info = pIVar4;
  (pIVar10->constraints).ptr = (args->constraints).ptr;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }